

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastInst.hpp
# Opt level: O3

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::matchNextAux
          (InstMatcher *this,TermList queryTerm,TermList nodeTerm,bool separate)

{
  bool bVar1;
  uint uVar2;
  byte bVar3;
  pair<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec>
  *ppVar4;
  pair<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec>
  *ppVar5;
  bool bVar6;
  int iVar7;
  Entry *pEVar8;
  socklen_t sVar9;
  socklen_t __len;
  undefined7 in_register_00000009;
  ulong uVar10;
  TermList TVar11;
  TermList var;
  byte bVar12;
  bool bVar13;
  ulong uVar14;
  socklen_t sVar15;
  socklen_t __fd;
  bool bVar16;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  TermSpec TVar20;
  TermList local_60;
  InstMatcher *local_58;
  uint local_50;
  uint local_4c;
  DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
  *local_48;
  undefined4 uStack_3c;
  undefined3 uStack_38;
  undefined4 local_34;
  
  bVar3 = 1;
  if ((~(uint)queryTerm._content & 3) == 0) {
    queryTerm._content = queryTerm._content & 0xffffffff;
    local_60._content = queryTerm._content;
    pEVar8 = Lib::
             DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
             ::findEntry(&this->_bindings,&local_60);
    if (pEVar8 == (Entry *)0x0) goto LAB_00314a0c;
    bVar12 = (pEVar8->_val).q;
    uStack_38 = (undefined3)((uint)*(undefined4 *)&(pEVar8->_val).field_0x4 >> 8);
    uStack_3c = *(undefined4 *)&(pEVar8->_val).field_0x1;
    queryTerm._content = (pEVar8->_val).t._content;
    if ((bVar12 & 1) == 0) {
      bVar3 = 0;
      goto LAB_0031470a;
    }
  }
  else {
    bVar12 = 1;
  }
  if ((((uint)queryTerm._content & 3) != 1) ||
     (local_60._content = queryTerm._content,
     pEVar8 = Lib::
              DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
              ::findEntry(&this->_bindings,&local_60), pEVar8 != (Entry *)0x0)) {
LAB_0031470a:
    if (((nodeTerm._content & 3) == 0) && ((*(byte *)(nodeTerm._content + 0x28) & 8) != 0)) {
      TVar11._content = nodeTerm._content;
      if (*(int *)(nodeTerm._content + 0xc) < 0) {
        iVar7 = 0;
        do {
          TVar11._content = *(ulong *)(TVar11._content + 0x20);
          if ((TVar11._content & 1) != 0) {
            iVar17 = 3;
            goto LAB_00314a41;
          }
          iVar7 = iVar7 + 2;
        } while (*(int *)(TVar11._content + 0xc) < 0);
      }
      else {
        iVar7 = 0;
      }
      iVar17 = *(int *)(TVar11._content + 0x20);
LAB_00314a41:
      if ((!(bool)(bVar3 ^ 1 | iVar7 + iVar17 != 0)) && ((queryTerm._content & 3) == 0)) {
        uVar10 = queryTerm._content;
        if (*(int *)(queryTerm._content + 0xc) < 0) {
          iVar7 = 0;
          do {
            uVar10 = *(ulong *)(uVar10 + 0x20);
            if ((uVar10 & 1) != 0) {
              iVar17 = 3;
              goto LAB_00314a8e;
            }
            iVar7 = iVar7 + 2;
          } while (*(int *)(uVar10 + 0xc) < 0);
        }
        else {
          iVar7 = 0;
        }
        iVar17 = *(int *)(uVar10 + 0x20);
LAB_00314a8e:
        if (iVar7 + iVar17 == 0) {
          bVar19 = queryTerm._content == nodeTerm._content;
LAB_003149db:
          if (separate == true && bVar19 == false) {
            backtrack(this);
            return false;
          }
          return bVar19;
        }
      }
    }
    if (matchNextAux(Kernel::TermList,Kernel::TermList,bool)::toDo == '\0') {
      matchNextAux();
    }
    if (matchNextAux(Kernel::TermList,Kernel::TermList,bool)::dsit == '\0') {
      matchNextAux();
    }
    matchNextAux::toDo._cursor = matchNextAux::toDo._stack;
    if (matchNextAux::toDo._stack == matchNextAux::toDo._end) {
      Lib::
      Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec>_>
      ::expand(&matchNextAux::toDo);
    }
    ppVar4 = matchNextAux::toDo._cursor;
    ((matchNextAux::toDo._cursor)->first).q = (bool)bVar12;
    *(undefined4 *)&(ppVar4->first).field_0x1 = uStack_3c;
    *(uint *)&(ppVar4->first).field_0x4 = CONCAT31(uStack_38,uStack_3c._3_1_);
    (ppVar4->first).t._content = queryTerm._content;
    (ppVar4->second).q = false;
    (ppVar4->second).t._content = nodeTerm._content;
    matchNextAux::toDo._cursor = matchNextAux::toDo._cursor + 1;
    if (matchNextAux::toDo._cursor == matchNextAux::toDo._stack) {
      return true;
    }
    local_34 = (undefined4)CONCAT71(in_register_00000009,separate);
    local_48 = &this->_bindings;
    local_58 = this;
    do {
      bVar19 = matchNextAux::toDo._cursor[-1].first.q;
      ppVar4 = matchNextAux::toDo._cursor + -1;
      bVar1 = matchNextAux::toDo._cursor[-1].second.q;
      ppVar5 = matchNextAux::toDo._cursor + -1;
      matchNextAux::toDo._cursor = matchNextAux::toDo._cursor + -1;
      Kernel::DisagreementSetIterator::reset
                (&matchNextAux::dsit,(TermList)(ppVar4->first).t._content,
                 (TermList)(ppVar5->second).t._content,(bool)((bVar1 ^ bVar19) & 1));
      bVar6 = Kernel::DisagreementSetIterator::hasNext(&matchNextAux::dsit);
      if (bVar6) {
        local_4c = (uint)(bVar1 & 1U);
        local_50 = (uint)(bVar19 & 1U);
        do {
          var._content = matchNextAux::dsit._arg2._content;
          TVar11._content = matchNextAux::dsit._arg1._content;
          uVar10 = matchNextAux::dsit._arg2._content & 3;
          bVar6 = uVar10 != 1;
          if ((bVar1 & 1U) != 0) {
            bVar6 = uVar10 != 0;
          }
          uVar18 = matchNextAux::dsit._arg2._content & 3;
          if (uVar18 == 0) {
            bVar6 = uVar10 != 0;
          }
          uVar10 = matchNextAux::dsit._arg1._content & 3;
          bVar16 = uVar10 != 1;
          if ((bVar19 & 1U) != 0) {
            bVar16 = uVar10 != 0;
          }
          uVar14 = matchNextAux::dsit._arg1._content & 3;
          matchNextAux::dsit._arg1._content = 2;
          if (uVar14 == 0) {
            bVar16 = uVar10 != 0;
          }
          if ((!bVar16) && (!bVar6)) {
            bVar19 = false;
            separate = SUB41(local_34,0);
            this = local_58;
            goto LAB_003149db;
          }
          iVar7 = (int)uVar14;
          sVar15 = (socklen_t)TVar11._content;
          sVar9 = (socklen_t)matchNextAux::dsit._arg2._content;
          if ((iVar7 == 1) && ((bVar19 & 1U) != 0)) {
            local_60._content = TVar11._content;
            pEVar8 = Lib::
                     DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
                     ::findEntry(local_48,&local_60);
            __len = sVar9;
            __fd = sVar15;
            uVar2 = local_4c;
            if (pEVar8 != (Entry *)0x0) goto LAB_003148bc;
LAB_003149a0:
            bind(local_58,__fd,(sockaddr *)(ulong)uVar2,__len);
          }
          else {
LAB_003148bc:
            iVar17 = (int)uVar18;
            if (((iVar17 == 1) && ((bVar1 & 1U) != 0)) || (iVar17 == 3)) {
              local_60._content = var._content;
              pEVar8 = Lib::
                       DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
                       ::findEntry(local_48,&local_60);
              __len = sVar15;
              __fd = sVar9;
              uVar2 = local_50;
              if (pEVar8 == (Entry *)0x0) goto LAB_003149a0;
            }
            if (iVar7 == 3) {
              local_60._content = TVar11._content;
              pEVar8 = Lib::
                       DHMap<Kernel::TermList,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,_Lib::DefaultHash,_Lib::DefaultHash2>
                       ::findEntry(local_48,&local_60);
              __len = sVar9;
              __fd = sVar15;
              uVar2 = local_4c;
              if (pEVar8 == (Entry *)0x0) goto LAB_003149a0;
            }
            bVar13 = (bool)(bVar19 & 1U);
            if (bVar16) {
              TVar20 = deref(local_58,TVar11);
              TVar11 = TVar20.t._content;
              bVar13 = TVar20.q;
            }
            bVar16 = (bool)(bVar1 & 1U);
            if (bVar6) {
              TVar20 = deref(local_58,var);
              var = TVar20.t._content;
              bVar16 = TVar20.q;
            }
            if (matchNextAux::toDo._cursor == matchNextAux::toDo._end) {
              Lib::
              Stack<std::pair<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec,_Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::TermSpec>_>
              ::expand(&matchNextAux::toDo);
            }
            ppVar4 = matchNextAux::toDo._cursor;
            ((matchNextAux::toDo._cursor)->first).q = bVar13;
            (ppVar4->first).t._content = TVar11._content;
            (ppVar4->second).q = bVar16;
            (ppVar4->second).t._content = var._content;
            matchNextAux::toDo._cursor = matchNextAux::toDo._cursor + 1;
          }
          bVar6 = Kernel::DisagreementSetIterator::hasNext(&matchNextAux::dsit);
        } while (bVar6);
      }
      if (matchNextAux::toDo._cursor == matchNextAux::toDo._stack) {
        return true;
      }
    } while( true );
  }
LAB_00314a0c:
  bind(this,(int)queryTerm._content,(sockaddr *)0x0,(socklen_t)nodeTerm._content);
  return true;
}

Assistant:

bool SubstitutionTree<LeafData_>::InstMatcher::matchNextAux(TermList queryTerm, TermList nodeTerm, bool separate)
{
  unsigned specVar;
  TermSpec tsBinding;

  TermSpec tsNode(false, nodeTerm);

  if(queryTerm.isSpecialVar()){
    specVar = queryTerm.var();
    if(!findSpecVarBinding(specVar,tsBinding)) {
      bind(TermList(specVar,true), tsNode);
      return true;
    }
  } else {
    tsBinding = TermSpec(true, queryTerm);
  }

  if(tsBinding.q && tsBinding.t.isOrdinaryVar() && !isBound(tsBinding.t)) {
    bind(tsBinding.t, tsNode);
    return true;
  }

  bool success;

  if(nodeTerm.isTerm() && nodeTerm.term()->shared() && nodeTerm.term()->ground() &&
      tsBinding.q && tsBinding.t.isTerm() && tsBinding.t.term()->ground()) {
    success=nodeTerm.term()==tsBinding.t.term();
    goto finish;
  }

  static Stack<std::pair<TermSpec,TermSpec> > toDo;
  static DisagreementSetIterator dsit;

  toDo.reset();
  toDo.push(std::make_pair(tsBinding, tsNode));

  while(toDo.isNonEmpty()) {
    TermSpec ts1=toDo.top().first;
    TermSpec ts2=toDo.pop().second;
//    ASS(!ts2.q); //ts2 is always a node term

    dsit.reset(ts1.t, ts2.t, ts1.q!=ts2.q);
    while(dsit.hasNext()) {
      std::pair<TermList,TermList> disarg=dsit.next();
      TermList dt1=disarg.first;
      TermList dt2=disarg.second;

      bool dt1Bindable= !dt1.isTerm() && (ts1.q || !dt1.isOrdinaryVar());
      bool dt2Bindable= !dt2.isTerm() && (ts2.q || !dt2.isOrdinaryVar());

      if(!dt1Bindable && !dt2Bindable) {
	success=false;
	goto finish;
      }

      //we try to bind ordinary variables first, as binding a special
      //variable to an ordinary variable does not allow us to cut off
      //children when entering a node (a term to bind the special variable
      //may come later, so we want to keep it unbound)

      if(ts1.q && dt1.isOrdinaryVar() && !isBound(dt1)) {
	bind(dt1, TermSpec(ts2.q,dt2));
	continue;
      }
      if(ts2.q && dt2.isOrdinaryVar() && !isBound(dt2)) {
	bind(dt2, TermSpec(ts1.q,dt1));
	continue;
      }

      if(dt2.isSpecialVar() && !isBound(dt2)) {
	ASS(!ts2.q);
	bind(dt2, TermSpec(ts1.q,dt1));
	continue;
      }
      if(dt1.isSpecialVar() && !isBound(dt1)) {
	ASS(!ts1.q);
	bind(dt1, TermSpec(ts2.q,dt2));
	continue;
      }

      TermSpec deref1=TermSpec(ts1.q, dt1);
      TermSpec deref2=TermSpec(ts2.q, dt2);
      if(dt1Bindable) {
	ASS(isBound(dt1)); //if unbound, we would have assigned it earlier
	deref1=deref(dt1);
      }
      if(dt2Bindable) {
	ASS(isBound(dt2));
	deref2=deref(dt2);
      }

      toDo.push(std::make_pair(deref1, deref2));
    }
  }
  success=true;

finish:
  if(!success) {
    //if this matching was joined to the previous one, we don't
    //have to care about unbinding as caller will do this by calling
    //backtrack for the matching we're joined to.
    if(separate) {
      //we have to unbind variables, that were bound.
      backtrack();
    }
  }
  return success;
}